

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool ra_range_uint32_array(roaring_array_t *ra,size_t offset,size_t limit,uint32_t *ans)

{
  uint16_t uVar1;
  uint8_t uVar2;
  int iVar3;
  void *__dest;
  long lVar4;
  _Bool _Var5;
  run_container_t *run;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  uint8_t *puVar12;
  void *local_80;
  long local_78;
  ulong local_58;
  long local_50;
  
  _Var5 = true;
  if (0 < ra->size) {
    lVar9 = 0;
    uVar10 = 0;
    local_58 = 0;
    local_80 = (void *)0x0;
    local_50 = 0;
    bVar11 = false;
    local_78 = 0;
    uVar7 = 0;
    do {
      puVar12 = ra->typecodes;
      run = (run_container_t *)ra->containers[lVar9];
      uVar2 = puVar12[lVar9];
      if (uVar2 == '\x04') {
        uVar2 = *(uint8_t *)&run->runs;
        puVar12[lVar9] = uVar2;
        if (uVar2 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        run = *(run_container_t **)run;
        puVar12 = ra->typecodes;
        uVar2 = puVar12[lVar9];
      }
      if (uVar2 == '\x03') {
        lVar4 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar4 + 4) & 0x20) == 0) {
          iVar3 = run->n_runs;
          lVar4 = (long)iVar3;
          if (0 < lVar4) {
            lVar6 = 0;
            do {
              iVar3 = iVar3 + (uint)run->runs[lVar6].length;
              lVar6 = lVar6 + 1;
            } while (lVar4 != lVar6);
          }
        }
        else {
          iVar3 = _avx2_run_container_cardinality(run);
        }
LAB_001188fd:
        local_78 = (long)iVar3;
      }
      else if ((uVar2 == '\x02') || (uVar2 == '\x01')) {
        iVar3 = run->n_runs;
        goto LAB_001188fd;
      }
      uVar8 = uVar7;
      if (uVar10 < limit + offset && offset <= (local_78 + uVar10) - 1) {
        if (!bVar11) {
          local_50 = offset - uVar10;
          local_58 = local_50 + limit;
          local_80 = calloc(1,local_58 * 4);
          if (local_80 == (void *)0x0) {
            return false;
          }
        }
        uVar8 = local_78 + uVar7;
        if (local_58 < uVar8) {
          local_58 = local_58 + local_78;
          __dest = calloc(1,local_58 * 4);
          if (__dest == (void *)0x0) {
            _Var5 = false;
            if (local_80 == (void *)0x0) {
              return false;
            }
            goto LAB_00118aeb;
          }
          memcpy(__dest,local_80,uVar7 * 4);
          free(local_80);
          puVar12 = ra->typecodes;
          local_80 = __dest;
        }
        uVar2 = puVar12[lVar9];
        if (uVar2 == '\x01') {
          bitset_container_to_uint32_array
                    ((uint32_t *)((long)local_80 + uVar7 * 4),(bitset_container_t *)run,
                     (uint)ra->keys[lVar9] << 0x10);
LAB_00118a88:
          bVar11 = true;
        }
        else {
          if (uVar2 == '\x02') {
            if (0 < run->n_runs) {
              uVar1 = ra->keys[lVar9];
              lVar4 = 0;
              do {
                *(uint *)((long)local_80 + lVar4 * 4 + uVar7 * 4) =
                     CONCAT22(uVar1,(&run->runs->value)[lVar4]);
                lVar4 = lVar4 + 1;
              } while (lVar4 < run->n_runs);
            }
          }
          else if (uVar2 == '\x03') {
            run_container_to_uint32_array
                      ((void *)((long)local_80 + uVar7 * 4),run,(uint)ra->keys[lVar9] << 0x10);
            goto LAB_00118a88;
          }
          bVar11 = true;
        }
      }
      if (limit <= uVar8 - local_50) break;
      uVar10 = uVar10 + local_78;
      lVar9 = lVar9 + 1;
      uVar7 = uVar8;
    } while (lVar9 < ra->size);
    _Var5 = true;
    if (local_80 != (void *)0x0) {
      memcpy(ans,(void *)((long)local_80 + local_50 * 4),limit << 2);
      _Var5 = true;
LAB_00118aeb:
      free(local_80);
    }
  }
  return _Var5;
}

Assistant:

bool ra_range_uint32_array(const roaring_array_t *ra, size_t offset, size_t limit, uint32_t *ans) {
    size_t ctr = 0;
    size_t dtr = 0;

    size_t t_limit = 0;

    bool first = false;
    size_t first_skip = 0;

    uint32_t *t_ans = NULL;
    size_t cur_len = 0;

    for (int i = 0; i < ra->size; ++i) {

        const container_t *c = container_unwrap_shared(
                                        ra->containers[i], &ra->typecodes[i]);
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                t_limit = (const_CAST_bitset(c))->cardinality;
                break;
            case ARRAY_CONTAINER_TYPE:
                t_limit = (const_CAST_array(c))->cardinality;
                break;
            case RUN_CONTAINER_TYPE:
                t_limit = run_container_cardinality(const_CAST_run(c));
                break;
        }
        if (ctr + t_limit - 1 >= offset && ctr < offset + limit){
            if (!first){
                //first_skip = t_limit - (ctr + t_limit - offset);
                first_skip = offset - ctr;
                first = true;
                t_ans = (uint32_t *)malloc(sizeof(*t_ans) * (first_skip + limit));
                if(t_ans == NULL) {
                  return false;
                }
                memset(t_ans, 0, sizeof(*t_ans) * (first_skip + limit)) ;
                cur_len = first_skip + limit;
            }
            if (dtr + t_limit > cur_len){
                uint32_t * append_ans = (uint32_t *)malloc(sizeof(*append_ans) * (cur_len + t_limit));
                if(append_ans == NULL) {
                  if(t_ans != NULL) free(t_ans);
                  return false;
                }
                memset(append_ans, 0, sizeof(*append_ans) * (cur_len + t_limit));
                cur_len = cur_len + t_limit;
                memcpy(append_ans, t_ans, dtr * sizeof(uint32_t));
                free(t_ans);
                t_ans = append_ans;
            }
            switch (ra->typecodes[i]) {
                case BITSET_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_bitset(c),  ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case ARRAY_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_array(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
                case RUN_CONTAINER_TYPE:
                    container_to_uint32_array(
                        t_ans + dtr,
                        const_CAST_run(c), ra->typecodes[i],
                        ((uint32_t)ra->keys[i]) << 16);
                    break;
            }
            dtr += t_limit;
        }
        ctr += t_limit;
        if (dtr-first_skip >= limit) break;
    }
    if(t_ans != NULL) {
      memcpy(ans, t_ans+first_skip, limit * sizeof(uint32_t));
      free(t_ans);
    }
    return true;
}